

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lazy.h
# Opt level: O0

part_head_t * __thiscall
async_simple::coro::detail::LazyAwaiterBase<cinatra::part_head_t>::awaitResume
          (LazyAwaiterBase<cinatra::part_head_t> *this)

{
  coroutine_handle<async_simple::coro::detail::LazyPromise<cinatra::part_head_t>_> *in_RSI;
  part_head_t *in_RDI;
  part_head_t r;
  part_head_t *this_00;
  LazyPromise<cinatra::part_head_t> *in_stack_ffffffffffffffa0;
  
  this_00 = in_RDI;
  std::coroutine_handle<async_simple::coro::detail::LazyPromise<cinatra::part_head_t>_>::promise
            (in_RSI);
  LazyPromise<cinatra::part_head_t>::result(in_stack_ffffffffffffffa0);
  cinatra::part_head_t::part_head_t(this_00,in_RDI);
  std::coroutine_handle<async_simple::coro::detail::LazyPromise<cinatra::part_head_t>_>::destroy
            ((coroutine_handle<async_simple::coro::detail::LazyPromise<cinatra::part_head_t>_> *)
             0x19226e);
  std::coroutine_handle<async_simple::coro::detail::LazyPromise<cinatra::part_head_t>_>::operator=
            (in_RSI,(nullptr_t)0x0);
  cinatra::part_head_t::part_head_t(this_00,in_RDI);
  cinatra::part_head_t::~part_head_t(this_00);
  return this_00;
}

Assistant:

auto awaitResume() {
        if constexpr (std::is_void_v<T>) {
            _handle.promise().result();
            // We need to destroy the handle expclictly since the awaited
            // coroutine after symmetric transfer couldn't release it self any
            // more.
            _handle.destroy();
            _handle = nullptr;
        } else {
            auto r = std::move(_handle.promise()).result();
            _handle.destroy();
            _handle = nullptr;
            return r;
        }
    }